

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_zstd.c
# Opt level: O2

int zstd_bidder_init(archive_read_filter *self)

{
  int iVar1;
  size_t __size;
  long *__ptr;
  void *__ptr_00;
  long lVar2;
  
  __size = ZSTD_DStreamOutSize();
  self->code = 0xe;
  self->name = "zstd";
  __ptr = (long *)calloc(1,0x28);
  __ptr_00 = malloc(__size);
  lVar2 = ZSTD_createDStream();
  if (lVar2 == 0 || (__ptr_00 == (void *)0x0 || __ptr == (long *)0x0)) {
    free(__ptr_00);
    free(__ptr);
    ZSTD_freeDStream(lVar2);
    archive_set_error(&self->archive->archive,0xc,"Can\'t allocate data for zstd decompression");
    iVar1 = -0x1e;
  }
  else {
    self->data = __ptr;
    __ptr[2] = __size;
    __ptr[1] = (long)__ptr_00;
    *__ptr = lVar2;
    self->vtable = &zstd_reader_vtable;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
zstd_bidder_init(struct archive_read_filter *self)
{
	struct private_data *state;
	size_t out_block_size = ZSTD_DStreamOutSize();
	void *out_block;
	ZSTD_DStream *dstream;

	self->code = ARCHIVE_FILTER_ZSTD;
	self->name = "zstd";

	state = calloc(1, sizeof(*state));
	out_block = malloc(out_block_size);
	dstream = ZSTD_createDStream();

	if (state == NULL || out_block == NULL || dstream == NULL) {
		free(out_block);
		free(state);
		ZSTD_freeDStream(dstream); /* supports free on NULL */
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for zstd decompression");
		return (ARCHIVE_FATAL);
	}

	self->data = state;

	state->out_block_size = out_block_size;
	state->out_block = out_block;
	state->dstream = dstream;
	self->vtable = &zstd_reader_vtable;

	state->eof = 0;
	state->in_frame = 0;

	return (ARCHIVE_OK);
}